

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setSizeIncrement(QWidget *this,int w,int h)

{
  QWidgetPrivate *this_00;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var1;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createTLExtra(this_00);
  QWidgetPrivate::createTLExtra(this_00);
  _Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
  super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
       (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
       super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
  if ((*(short *)((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t
                        .super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x88) != w) ||
     (*(short *)((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x8a) != h)) {
    *(short *)((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                     super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                     super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x88) = (short)w;
    *(short *)((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                     super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                     super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x8a) = (short)h;
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      QWidgetPrivate::setConstraints_sys(this_00);
      return;
    }
  }
  return;
}

Assistant:

void QWidget::setSizeIncrement(int w, int h)
{
    Q_D(QWidget);
    d->createTLExtra();
    QTLWExtra* x = d->topData();
    if (x->incw == w && x->inch == h)
        return;
    x->incw = w;
    x->inch = h;
    if (isWindow())
        d->setConstraints_sys();
}